

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O2

FreePageEntry * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::BackgroundPageQueue::PopFreePageEntry(BackgroundPageQueue *this)

{
  FreePageEntry *pFVar1;
  AutoCriticalSection local_20;
  AutoCriticalSection autoCS;
  
  local_20.cs = &this->backgroundPageQueueCriticalSection;
  CCLock::Enter(&(local_20.cs)->super_CCLock);
  pFVar1 = this->bgFreePageList;
  if (pFVar1 != (FreePageEntry *)0x0) {
    this->bgFreePageList = pFVar1->Next;
  }
  AutoCriticalSection::~AutoCriticalSection(&local_20);
  return pFVar1;
}

Assistant:

FreePageEntry* PopFreePageEntry()
        {
#if SUPPORT_WIN32_SLIST
            return (FreePageEntry *)::InterlockedPopEntrySList(&bgFreePageList);
#else
            AutoCriticalSection autoCS(&backgroundPageQueueCriticalSection);
            FreePageEntry* head = bgFreePageList;
            if (head)
            {
                bgFreePageList = bgFreePageList->Next;
            }
            return head;
#endif
        }